

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O2

int convert_16sp(uchar *data,_sample *gus_sample)

{
  ulong uVar1;
  uchar *puVar2;
  undefined2 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  short *psVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  uchar *puVar14;
  undefined2 *puVar15;
  undefined2 *puVar16;
  uchar *puVar17;
  long lVar18;
  ulong uVar19;
  
  uVar4 = gus_sample->loop_end;
  uVar5 = gus_sample->data_length;
  uVar6 = gus_sample->loop_start;
  uVar19 = (ulong)(uVar4 - uVar6);
  uVar1 = (ulong)uVar5 + uVar19 * 2;
  psVar9 = (short *)calloc((uVar1 >> 1) + 2,2);
  gus_sample->data = psVar9;
  if (psVar9 == (short *)0x0) {
    piVar11 = __errno_location();
    _WM_ERROR("convert_16sp",0x1b8,1,"to parse sample",*piVar11);
    iVar8 = -1;
  }
  else {
    lVar7 = uVar19 * 2;
    lVar13 = 0;
    do {
      lVar12 = lVar13;
      *(undefined2 *)((long)psVar9 + lVar12) = *(undefined2 *)(data + lVar12);
      lVar13 = lVar12 + 2;
    } while (data + lVar12 + 2 < data + uVar6);
    uVar3 = *(undefined2 *)(data + lVar13);
    *(undefined2 *)((long)psVar9 + lVar13) = uVar3;
    lVar18 = (long)psVar9 + lVar7 + lVar13;
    puVar15 = (undefined2 *)((long)psVar9 + lVar7 + 2 + lVar13);
    puVar15[-1] = uVar3;
    puVar16 = (undefined2 *)((long)psVar9 + lVar12 + 4);
    lVar10 = (long)psVar9 + lVar7 + lVar13 + 4;
    puVar14 = data + lVar12 + 6;
    puVar2 = data + lVar13 + 2;
    do {
      puVar17 = puVar2;
      uVar3 = *(undefined2 *)puVar17;
      *puVar16 = uVar3;
      *(undefined2 *)(lVar18 + -2) = uVar3;
      lVar18 = lVar18 + -2;
      *puVar15 = *puVar16;
      puVar15 = puVar15 + 1;
      puVar16 = puVar16 + 1;
      puVar14 = puVar14 + 2;
      lVar10 = lVar10 + 2;
      puVar2 = puVar17 + 2;
    } while (puVar17 + 2 < data + uVar4);
    uVar3 = *(undefined2 *)(puVar17 + 2);
    *puVar16 = uVar3;
    *puVar15 = uVar3;
    if (puVar17 + 4 != data + uVar5) {
      lVar13 = 0;
      do {
        puVar2 = puVar14 + lVar13;
        *(undefined2 *)(lVar10 + lVar13) = *(undefined2 *)puVar2;
        lVar13 = lVar13 + 2;
      } while (puVar2 + 2 < data + uVar5);
    }
    gus_sample->modes = gus_sample->modes ^ 8;
    gus_sample->loop_start = uVar4 >> 1;
    gus_sample->loop_end = (int)lVar7 + uVar4 >> 1;
    gus_sample->data_length = (uint)(uVar1 >> 1) & 0x7fffffff;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int convert_16sp(unsigned char *data, struct _sample *gus_sample) {
	unsigned long int loop_length = gus_sample->loop_end
			- gus_sample->loop_start;
	unsigned long int dloop_length = loop_length * 2;
	unsigned long int new_length = gus_sample->data_length + dloop_length;
	unsigned char *read_data = data;
	unsigned char *read_end = data + gus_sample->loop_start;
	signed short int *write_data = NULL;
	signed short int *write_data_a = NULL;
	signed short int *write_data_b = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc(((new_length >> 1) + 2),
			sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data = (*read_data++);
			*write_data++ |= (*read_data++) << 8;
		} while (read_data < read_end);

		*write_data = (*read_data++);
		*write_data |= (*read_data++) << 8;
		write_data_a = write_data + (dloop_length >> 1);
		*write_data_a-- = *write_data;
		write_data++;
		write_data_b = write_data + (dloop_length >> 1);
		read_end = data + gus_sample->loop_end;
		do {
			*write_data = (*read_data++);
			*write_data |= (*read_data++) << 8;
			*write_data_a-- = *write_data;
			*write_data_b++ = *write_data;
			write_data++;
		} while (read_data < read_end);

		*write_data = *(read_data++);
		*write_data |= (*read_data++) << 8;
		*write_data_b++ = *write_data;
		read_end = data + gus_sample->data_length;
		if (read_data != read_end) {
			do {
				*write_data_b = *(read_data++);
				*write_data_b++ |= (*read_data++) << 8;
			} while (read_data < read_end);
		}
		gus_sample->loop_start += loop_length;
		gus_sample->loop_end += dloop_length;
		gus_sample->data_length = new_length;
		gus_sample->modes ^= SAMPLE_PINGPONG;
		gus_sample->loop_start >>= 1;
		gus_sample->loop_end >>= 1;
		gus_sample->data_length >>= 1;
		return 0;
	}

	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}